

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal-c.cpp
# Opt level: O2

duckdb_hugeint duckdb::FetchInternals<duckdb::hugeint_t>(void *source_address)

{
  bool bVar1;
  duckdb_hugeint dVar2;
  hugeint_t local_10;
  
  bVar1 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(*source_address,&local_10,false);
  if (!bVar1) {
    local_10 = FetchDefaultValue::Operation<duckdb::hugeint_t>();
  }
  dVar2.lower = local_10.lower;
  dVar2.upper = local_10.upper;
  return dVar2;
}

Assistant:

duckdb_hugeint FetchInternals<hugeint_t>(void *source_address) {
	duckdb_hugeint result;
	hugeint_t intermediate_result;

	if (!TryCast::Operation<hugeint_t, hugeint_t>(UnsafeFetchFromPtr<hugeint_t>(source_address), intermediate_result)) {
		intermediate_result = FetchDefaultValue::Operation<hugeint_t>();
	}
	result.lower = intermediate_result.lower;
	result.upper = intermediate_result.upper;
	return result;
}